

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O0

int __thiscall
Centaurus::CATNMachine<char>::import_whitespace
          (CATNMachine<char> *this,CharClass<char> *cc,int origin,int tag)

{
  reference this_00;
  CharClass<char> local_40;
  int local_20;
  int local_1c;
  int tag_local;
  int origin_local;
  CharClass<char> *cc_local;
  CATNMachine<char> *this_local;
  
  local_20 = tag;
  local_1c = origin;
  _tag_local = cc;
  cc_local = (CharClass<char> *)this;
  CharClass<char>::CharClass(&local_40);
  local_1c = add_node(this,&local_40,local_1c,local_20);
  CharClass<char>::~CharClass(&local_40);
  this_00 = std::vector<Centaurus::CATNNode<char>,_std::allocator<Centaurus::CATNNode<char>_>_>::
            operator[](&this->m_nodes,(long)local_1c);
  CATNNode<char>::add_transition(this_00,_tag_local,local_1c,0);
  return local_1c;
}

Assistant:

int import_whitespace(const CharClass<TCHAR>& cc, int origin, int tag)
    {
        origin = add_node(CharClass<TCHAR>(), origin, tag);
        m_nodes[origin].add_transition(cc, origin);
        return origin;
    }